

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall UdpSocketImpl::UdpSocketImpl(UdpSocketImpl *this,BaseSocket *pBkRef)

{
  BaseSocket *pBkRef_local;
  UdpSocketImpl *this_local;
  
  BaseSocketImpl::BaseSocketImpl(&this->super_BaseSocketImpl);
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__UdpSocketImpl_001b9550;
  std::
  function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->m_fnSslDecode);
  std::mutex::mutex(&this->m_mxInDeque);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::deque(&this->m_quInData);
  std::
  function<int_(const_unsigned_char_*,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->m_fnSslEncode);
  std::mutex::mutex(&this->m_mxOutDeque);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::deque(&this->m_quOutData);
  this->m_bCloseReq = false;
  std::mutex::mutex(&this->m_mxWrite);
  std::condition_variable::condition_variable(&this->m_cv);
  std::function<void_(UdpSocket_*)>::function(&this->m_fBytesReceived);
  std::function<void_(UdpSocket_*,_void_*)>::function(&this->m_fBytesReceivedParam);
  std::atomic_init<unsigned_long>(&this->m_atInBytes,0);
  std::atomic_init<unsigned_long>(&this->m_atOutBytes,0);
  (this->super_BaseSocketImpl).m_pBkRef = pBkRef;
  return;
}

Assistant:

UdpSocketImpl::UdpSocketImpl(BaseSocket* pBkRef) : m_bCloseReq(false)
{
    atomic_init(&m_atInBytes, static_cast<size_t>(0));
    atomic_init(&m_atOutBytes, static_cast<size_t>(0));
    m_pBkRef = pBkRef;
}